

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void TrackUsedInit(Disk *disk)

{
  bool bVar1;
  undefined1 auVar2 [12];
  byte bVar3;
  Disk *pDVar4;
  bool bVar5;
  byte bVar6;
  uchar *puVar7;
  exception *peVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  byte *pbVar9;
  int iVar10;
  uint8_t head;
  ulong uStack_178;
  uint8_t cyl_1;
  size_t i_1;
  size_t i;
  MGT_DIR *pdi;
  Data *data;
  int entry;
  CylHead local_144;
  CylHead cylhead;
  uint8_t sec;
  uint8_t cyl;
  Data *data1;
  MGT_DISK_INFO di;
  Header local_f0;
  Sector *local_e0;
  Sector *sector;
  uint8_t abBAM [195];
  bool fDone;
  Disk *disk_local;
  
  abBAM[0xbf] = '\0';
  unique0x1000049b = disk;
  memset(&sector,0,0xc3);
  memset(adwUsed,0,0x18);
  pDVar4 = stack0xfffffffffffffff0;
  adwUsed[0][0] = adwUsed[0][0] | 0x11;
  local_e0 = (Sector *)0x0;
  Header::Header(&local_f0,0,0,1,2);
  bVar5 = Disk::find(pDVar4,&local_f0,&local_e0);
  bVar1 = true;
  if (bVar5) {
    iVar10 = Sector::data_size(local_e0);
    bVar1 = iVar10 < 0x200;
  }
  if (!bVar1) {
    MGT_DISK_INFO::MGT_DISK_INFO((MGT_DISK_INFO *)&data1);
    register0x00000000 =
         &Sector::data_copy(local_e0,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>
    ;
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(register0x00000000);
    GetDiskInfo(puVar7,(MGT_DISK_INFO *)&data1);
    cylhead.cyl._3_1_ = 0;
    do {
      if ((abBAM[0xbf] & 1) != 0 || data1._4_4_ <= (int)(uint)cylhead.cyl._3_1_) {
        for (uStack_178 = 0; uStack_178 < 0x618; uStack_178 = uStack_178 + 1) {
          if (((uint)abBAM[(uStack_178 >> 3) - 8] & 1 << ((byte)uStack_178 & 7)) != 0) {
            auVar2._8_4_ = 0;
            auVar2._0_8_ = uStack_178;
            bVar6 = SUB121(auVar2 / ZEXT812(10),0) + 4;
            bVar3 = bVar6 / 0x50;
            bVar6 = bVar6 % 0x50;
            iVar10 = (int)(uint)bVar6 >> 5;
            adwUsed[bVar3][iVar10] = 1 << (bVar6 & 0x1f) | adwUsed[bVar3][iVar10];
          }
        }
        MGT_DISK_INFO::~MGT_DISK_INFO((MGT_DISK_INFO *)&data1);
        return;
      }
      for (cylhead.cyl._2_1_ = 1; (abBAM[0xbf] & 1) == 0 && cylhead.cyl._2_1_ < 0xb;
          cylhead.cyl._2_1_ = cylhead.cyl._2_1_ + 1) {
        if ((cylhead.cyl._3_1_ != 4) || (cylhead.cyl._2_1_ != 1)) {
          CylHead::CylHead(&local_144,(uint)cylhead.cyl._3_1_,0);
          pDVar4 = stack0xfffffffffffffff0;
          Header::Header((Header *)((long)&data + 4),(uint)cylhead.cyl._3_1_,0,
                         (uint)cylhead.cyl._2_1_,2);
          bVar5 = Disk::find(pDVar4,(Header *)((long)&data + 4),&local_e0);
          bVar1 = true;
          if (bVar5) {
            iVar10 = Sector::data_size(local_e0);
            bVar1 = iVar10 < 0x200;
          }
          if (bVar1) {
            peVar8 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::
            exception<char_const(&)[5],unsigned_char&,char_const(&)[16],unsigned_char&,char_const(&)[11]>
                      (peVar8,(char (*) [5])"cyl ",(uchar *)((long)&cylhead.cyl + 3),
                       (char (*) [16])" head 0 sector ",(uchar *)((long)&cylhead.cyl + 2),
                       (char (*) [11])0x2aa9c2);
            __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
          }
          for (data._0_4_ = 0; (abBAM[0xbf] & 1) == 0 && (int)data < 2; data._0_4_ = (int)data + 1)
          {
            this = &Sector::data_copy(local_e0,0)->
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this);
            pbVar9 = puVar7 + ((int)data << 8);
            if ((*pbVar9 & 0x3f) == 0) {
              abBAM[0xbf] = (pbVar9[1] != 0 ^ 0xffU) & 1;
            }
            else {
              adwUsed[0][(int)(uint)cylhead.cyl._3_1_ >> 5] =
                   1 << (cylhead.cyl._3_1_ & 0x1f) | adwUsed[0][(int)(uint)cylhead.cyl._3_1_ >> 5];
              if ((((int)data == 1) && (cylhead.cyl._2_1_ == 9)) &&
                 ((uint)cylhead.cyl._3_1_ != data1._4_4_ - 1U)) {
                iVar10 = (int)(cylhead.cyl._3_1_ + 1) >> 5;
                adwUsed[0][iVar10] = 1 << (cylhead.cyl._3_1_ + 1 & 0x1f) | adwUsed[0][iVar10];
              }
              for (i_1 = 0; i_1 < 0xc3; i_1 = i_1 + 1) {
                abBAM[i_1 - 8] = abBAM[i_1 - 8] | pbVar9[i_1 + 0xf];
              }
            }
          }
        }
      }
      cylhead.cyl._3_1_ = cylhead.cyl._3_1_ + 1;
    } while( true );
  }
  peVar8 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[23]>(peVar8,(char (*) [23])"disk is not MGT format");
  __cxa_throw(peVar8,&util::exception::typeinfo,util::exception::~exception);
}

Assistant:

void TrackUsedInit(Disk& disk)
{
    bool fDone = false;
    uint8_t abBAM[195] = {};

    // Tracks 0 and 4 cover the (empty) directory start and boot sector, and are always used
    memset(&adwUsed, 0, sizeof(adwUsed));
    adwUsed[0][0] |= 0x00000011;

    const Sector* sector = nullptr;
    if (!disk.find(Header(0, 0, 1, 2), sector) || sector->data_size() < SECTOR_SIZE)
        throw util::exception("disk is not MGT format");

    MGT_DISK_INFO di;
    const Data& data1 = sector->data_copy();
    GetDiskInfo(data1.data(), di);

    for (uint8_t cyl = 0; !fDone && cyl < di.dir_tracks; ++cyl)
    {
        for (uint8_t sec = 1; !fDone && sec <= MGT_SECTORS; ++sec)
        {
            // Skip the boot sector on MasterDOS extended directories
            if (cyl == 4 && sec == 1)
                continue;

            CylHead cylhead(cyl, 0);
            if (!disk.find(Header(cyl, 0, sec, 2), sector) || sector->data_size() < SECTOR_SIZE)
                throw util::exception("cyl ", cyl, " head 0 sector ", sec, " not found");

            for (int entry = 0; !fDone && entry < 2; ++entry)
            {
                const Data& data = sector->data_copy();
                const MGT_DIR* pdi = reinterpret_cast<const MGT_DIR*>(data.data() + ((SECTOR_SIZE / 2) * entry));

                if (pdi->bType & 0x3f)
                {
                    // Mark the current track as used
                    adwUsed[0][cyl >> 5] |= (1 << (cyl & 0x1f));

                    // If the final entry of the non-final track is in use, ensure the next track is considered used
                    if (entry == 1 && sec == (MGT_SECTORS - 1) && cyl != (di.dir_tracks - 1))
                        adwUsed[0][(cyl + 1) >> 5] |= (1 << ((cyl + 1) & 0x1f));

                    // Merge the sector address map into the overall disk BAM
                    for (size_t i = 0; i < sizeof(abBAM); ++i)
                        abBAM[i] |= pdi->abSectorMap[i];
                }
                else
                    fDone = !pdi->abName[0];
            }
        }
    }

    // Convert the BAM used sectors to our used tracks
    for (size_t i = 0; i < (sizeof(abBAM) << 3); ++i)
    {
        // Sector in use?
        if (abBAM[i >> 3] & (1 << (i & 7)))
        {
            uint8_t cyl = static_cast<uint8_t>((i / MGT_SECTORS) + MGT_DIR_TRACKS);
            uint8_t head = cyl / NORMAL_TRACKS;

            cyl %= NORMAL_TRACKS;
            adwUsed[head][cyl >> 5] |= (1 << (cyl & 0x1f));
        }
    }
}